

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apple_sysf.cpp
# Opt level: O2

void __thiscall apple_sysf_t::sysf_store_body_t::_read(sysf_store_body_t *this)

{
  uint64_t uVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  __type _Var2;
  bool bVar3;
  uint8_t uVar4;
  pointer __p;
  pointer __p_00;
  tuple<apple_sysf_t::sysf_variable_t_*,_std::default_delete<apple_sysf_t::sysf_variable_t>_>
  this_01;
  pointer __p_01;
  allocator<char> local_79;
  __uniq_ptr_impl<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>
  local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __p_00 = (pointer)operator_new(0x18);
  (__p_00->
  super__Vector_base<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p_00->
  super__Vector_base<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p_00->
  super__Vector_base<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50._M_dataplus._M_p = (pointer)0x0;
  std::
  __uniq_ptr_impl<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>_>_>
  ::reset((__uniq_ptr_impl<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>_>_>
           *)&this->m_variables,__p_00);
  std::
  unique_ptr<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>_>_>
                 *)&local_50);
  do {
    this_01.
    super__Tuple_impl<0UL,_apple_sysf_t::sysf_variable_t_*,_std::default_delete<apple_sysf_t::sysf_variable_t>_>
    .super__Head_base<0UL,_apple_sysf_t::sysf_variable_t_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_apple_sysf_t::sysf_variable_t_*,_std::default_delete<apple_sysf_t::sysf_variable_t>_>
          )operator_new(0x80);
    sysf_variable_t::sysf_variable_t
              ((sysf_variable_t *)
               this_01.
               super__Tuple_impl<0UL,_apple_sysf_t::sysf_variable_t_*,_std::default_delete<apple_sysf_t::sysf_variable_t>_>
               .super__Head_base<0UL,_apple_sysf_t::sysf_variable_t_*,_false>._M_head_impl,
               (this->super_kstruct).m__io,this,this->m__root);
    local_78._M_t.
    super__Tuple_impl<0UL,_apple_sysf_t::sysf_variable_t_*,_std::default_delete<apple_sysf_t::sysf_variable_t>_>
    .super__Head_base<0UL,_apple_sysf_t::sysf_variable_t_*,_false>._M_head_impl =
         (tuple<apple_sysf_t::sysf_variable_t_*,_std::default_delete<apple_sysf_t::sysf_variable_t>_>
          )(tuple<apple_sysf_t::sysf_variable_t_*,_std::default_delete<apple_sysf_t::sysf_variable_t>_>
            )this_01.
             super__Tuple_impl<0UL,_apple_sysf_t::sysf_variable_t_*,_std::default_delete<apple_sysf_t::sysf_variable_t>_>
             .super__Head_base<0UL,_apple_sysf_t::sysf_variable_t_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,std::default_delete<apple_sysf_t::sysf_variable_t>>,std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,std::default_delete<apple_sysf_t::sysf_variable_t>>>>
    ::
    emplace_back<std::unique_ptr<apple_sysf_t::sysf_variable_t,std::default_delete<apple_sysf_t::sysf_variable_t>>>
              ((vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,std::default_delete<apple_sysf_t::sysf_variable_t>>,std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,std::default_delete<apple_sysf_t::sysf_variable_t>>>>
                *)(this->m_variables)._M_t.
                  super___uniq_ptr_impl<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>_>_>
                  .
                  super__Head_base<0UL,_std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>_*,_false>
                  ._M_head_impl,
               (unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>
                *)&local_78);
    if ((_Tuple_impl<0UL,_apple_sysf_t::sysf_variable_t_*,_std::default_delete<apple_sysf_t::sysf_variable_t>_>
         )local_78._M_t.
          super__Tuple_impl<0UL,_apple_sysf_t::sysf_variable_t_*,_std::default_delete<apple_sysf_t::sysf_variable_t>_>
          .super__Head_base<0UL,_apple_sysf_t::sysf_variable_t_*,_false>._M_head_impl !=
        (sysf_variable_t *)0x0) {
      (**(code **)(*(long *)local_78._M_t.
                            super__Tuple_impl<0UL,_apple_sysf_t::sysf_variable_t_*,_std::default_delete<apple_sysf_t::sysf_variable_t>_>
                            .super__Head_base<0UL,_apple_sysf_t::sysf_variable_t_*,_false>.
                            _M_head_impl + 8))();
    }
    uVar1 = *(uint64_t *)
             ((long)this_01.
                    super__Tuple_impl<0UL,_apple_sysf_t::sysf_variable_t_*,_std::default_delete<apple_sysf_t::sysf_variable_t>_>
                    .super__Head_base<0UL,_apple_sysf_t::sysf_variable_t_*,_false>._M_head_impl +
             0x10);
    if (uVar1 == 3) {
      std::__cxx11::string::string
                ((string *)&local_50,
                 (string *)
                 ((long)this_01.
                        super__Tuple_impl<0UL,_apple_sysf_t::sysf_variable_t_*,_std::default_delete<apple_sysf_t::sysf_variable_t>_>
                        .super__Head_base<0UL,_apple_sysf_t::sysf_variable_t_*,_false>._M_head_impl
                 + 0x20));
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"EOF",&local_79);
      _Var2 = std::operator==(&local_50,&local_70);
      if (_Var2) {
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        break;
      }
    }
    bVar3 = kaitai::kstream::is_eof((this->super_kstruct).m__io);
    if (uVar1 == 3) {
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
    }
  } while (!bVar3);
  __p_01 = (pointer)operator_new(0x18);
  (__p_01->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__p_01->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p_01->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_t.
  super__Tuple_impl<0UL,_apple_sysf_t::sysf_variable_t_*,_std::default_delete<apple_sysf_t::sysf_variable_t>_>
  .super__Head_base<0UL,_apple_sysf_t::sysf_variable_t_*,_false>._M_head_impl =
       (tuple<apple_sysf_t::sysf_variable_t_*,_std::default_delete<apple_sysf_t::sysf_variable_t>_>)
       (_Tuple_impl<0UL,_apple_sysf_t::sysf_variable_t_*,_std::default_delete<apple_sysf_t::sysf_variable_t>_>
        )0x0;
  std::
  __uniq_ptr_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::reset((__uniq_ptr_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           *)&this->m_zeroes,__p_01);
  std::
  unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)&local_78);
  while (bVar3 = kaitai::kstream::is_eof((this->super_kstruct).m__io), !bVar3) {
    this_00 = (this->m_zeroes)._M_t.
              super___uniq_ptr_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              .
              super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_false>
              ._M_head_impl;
    uVar4 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    local_78._M_t.
    super__Tuple_impl<0UL,_apple_sysf_t::sysf_variable_t_*,_std::default_delete<apple_sysf_t::sysf_variable_t>_>
    .super__Head_base<0UL,_apple_sysf_t::sysf_variable_t_*,_false>._M_head_impl._0_1_ = uVar4;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (this_00,(uchar *)&local_78);
  }
  return;
}

Assistant:

void apple_sysf_t::sysf_store_body_t::_read() {
    m_variables = std::unique_ptr<std::vector<std::unique_ptr<sysf_variable_t>>>(new std::vector<std::unique_ptr<sysf_variable_t>>());
    {
        int i = 0;
        sysf_variable_t* _;
        do {
            _ = new sysf_variable_t(m__io, this, m__root);
            m_variables->push_back(std::move(std::unique_ptr<sysf_variable_t>(_)));
            i++;
        } while (!( (( ((_->len_name() == 3) && (_->name() == (std::string("EOF")))) ) || (_io()->is_eof())) ));
    }
    m_zeroes = std::unique_ptr<std::vector<uint8_t>>(new std::vector<uint8_t>());
    {
        int i = 0;
        while (!m__io->is_eof()) {
            m_zeroes->push_back(std::move(m__io->read_u1()));
            i++;
        }
    }
}